

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_evictset(ASMState *as,RegSet drop)

{
  byte bVar1;
  uint uVar2;
  uint in_ESI;
  ASMState *in_RDI;
  Reg r_1;
  Reg r;
  RegSet work;
  uint local_20;
  
  in_RDI->modset = in_ESI | in_RDI->modset;
  local_20 = in_ESI & (in_RDI->freeset ^ 0xffffffff) & 0xffff0000;
  do {
    if (local_20 == 0) {
      local_20 = in_ESI & (in_RDI->freeset ^ 0xffffffff);
      do {
        if (local_20 == 0) {
          return;
        }
        bVar1 = 0;
        for (uVar2 = local_20; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
          bVar1 = bVar1 + 1;
        }
        ra_restore(in_RDI,in_ESI);
        local_20 = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & local_20;
      } while (in_RDI->mclim <= in_RDI->mcp);
      asm_mclimit((ASMState *)0x1984a4);
    }
    bVar1 = 0;
    for (uVar2 = local_20; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
      bVar1 = bVar1 + 1;
    }
    ra_restore(in_RDI,in_ESI);
    local_20 = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & local_20;
  } while (in_RDI->mclim <= in_RDI->mcp);
  asm_mclimit((ASMState *)0x198416);
}

Assistant:

static void ra_evictset(ASMState *as, RegSet drop)
{
  RegSet work;
  as->modset |= drop;
#if !LJ_SOFTFP
  work = (drop & ~as->freeset) & RSET_FPR;
  while (work) {
    Reg r = rset_pickbot(work);
    ra_restore(as, regcost_ref(as->cost[r]));
    rset_clear(work, r);
    checkmclim(as);
  }
#endif
  work = (drop & ~as->freeset);
  while (work) {
    Reg r = rset_pickbot(work);
    ra_restore(as, regcost_ref(as->cost[r]));
    rset_clear(work, r);
    checkmclim(as);
  }
}